

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O3

void leveldb::_Test_Append::_RunIt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  WriteBatch *b;
  WriteBatch *b_00;
  WriteBatch *b_01;
  WriteBatch *b_02;
  string sStack_218;
  WriteBatch WStack_1f8;
  WriteBatch WStack_1d8;
  Tester TStack_1b8;
  
  WriteBatch::WriteBatch(&WStack_1d8);
  WriteBatch::WriteBatch(&WStack_1f8);
  WriteBatchInternal::SetSequence(&WStack_1d8,200);
  WriteBatchInternal::SetSequence(&WStack_1f8,300);
  WriteBatch::Append(&WStack_1d8,&WStack_1f8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  TStack_1b8.line_ = 0x61;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&TStack_1b8 + 0x18));
  PrintContents_abi_cxx11_(&sStack_218,(leveldb *)&WStack_1d8,b);
  test::Tester::IsEq<char[1],std::__cxx11::string>(&TStack_1b8,(char (*) [1])0x10d022,&sStack_218);
  paVar1 = &sStack_218.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_218._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_218._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8._0_8_ = "a";
  TStack_1b8.fname_ = (char *)0x1;
  sStack_218._M_dataplus._M_p = "va";
  sStack_218._M_string_length = 2;
  WriteBatch::Put(&WStack_1f8,(Slice *)&TStack_1b8,(Slice *)&sStack_218);
  WriteBatch::Append(&WStack_1d8,&WStack_1f8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  TStack_1b8.line_ = 100;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&TStack_1b8 + 0x18));
  PrintContents_abi_cxx11_(&sStack_218,(leveldb *)&WStack_1d8,b_00);
  test::Tester::IsEq<char[15],std::__cxx11::string>
            (&TStack_1b8,(char (*) [15])"Put(a, va)@200",&sStack_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_218._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_218._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  WriteBatch::Clear(&WStack_1f8);
  TStack_1b8._0_8_ = "b";
  TStack_1b8.fname_ = (char *)0x1;
  sStack_218._M_dataplus._M_p = "vb";
  sStack_218._M_string_length = 2;
  WriteBatch::Put(&WStack_1f8,(Slice *)&TStack_1b8,(Slice *)&sStack_218);
  WriteBatch::Append(&WStack_1d8,&WStack_1f8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  TStack_1b8.line_ = 0x6b;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&TStack_1b8 + 0x18));
  PrintContents_abi_cxx11_(&sStack_218,(leveldb *)&WStack_1d8,b_01);
  test::Tester::IsEq<char[29],std::__cxx11::string>
            (&TStack_1b8,(char (*) [29])"Put(a, va)@200Put(b, vb)@201",&sStack_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_218._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_218._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8._0_8_ = "foo";
  TStack_1b8.fname_ = (char *)0x3;
  WriteBatch::Delete(&WStack_1f8,(Slice *)&TStack_1b8);
  WriteBatch::Append(&WStack_1d8,&WStack_1f8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  TStack_1b8.line_ = 0x73;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&TStack_1b8 + 0x18));
  PrintContents_abi_cxx11_(&sStack_218,(leveldb *)&WStack_1d8,b_02);
  test::Tester::IsEq<char[58],std::__cxx11::string>
            (&TStack_1b8,(char (*) [58])"Put(a, va)@200Put(b, vb)@202Put(b, vb)@201Delete(foo)@203",
             &sStack_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_218._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_218._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1b8);
  WriteBatch::~WriteBatch(&WStack_1f8);
  WriteBatch::~WriteBatch(&WStack_1d8);
  return;
}

Assistant:

TEST(WriteBatchTest, Append) {
  WriteBatch b1, b2;
  WriteBatchInternal::SetSequence(&b1, 200);
  WriteBatchInternal::SetSequence(&b2, 300);
  b1.Append(b2);
  ASSERT_EQ("", PrintContents(&b1));
  b2.Put("a", "va");
  b1.Append(b2);
  ASSERT_EQ("Put(a, va)@200", PrintContents(&b1));
  b2.Clear();
  b2.Put("b", "vb");
  b1.Append(b2);
  ASSERT_EQ(
      "Put(a, va)@200"
      "Put(b, vb)@201",
      PrintContents(&b1));
  b2.Delete("foo");
  b1.Append(b2);
  ASSERT_EQ(
      "Put(a, va)@200"
      "Put(b, vb)@202"
      "Put(b, vb)@201"
      "Delete(foo)@203",
      PrintContents(&b1));
}